

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O1

void Ins_UNKNOWN(TT_ExecContext exc)

{
  int iVar1;
  TT_CallStack pTVar2;
  FT_Byte *pFVar3;
  long lVar4;
  long lVar5;
  TT_DefArray pTVar6;
  TT_DefArray pTVar7;
  
  pTVar6 = exc->IDefs;
  if (pTVar6 == (TT_DefArray)0x0) {
    pTVar7 = (TT_DefArray)0x0;
  }
  else {
    pTVar7 = pTVar6 + exc->numIDefs;
  }
  if (pTVar6 < pTVar7) {
    do {
      if ((exc->opcode == (FT_Byte)pTVar6->opc) && (pTVar6->active != '\0')) {
        iVar1 = exc->callTop;
        if (iVar1 < exc->callSize) {
          pTVar2 = exc->callStack;
          exc->callTop = iVar1 + 1;
          pTVar2[iVar1].Caller_Range = exc->curRange;
          pTVar2[iVar1].Caller_IP = exc->IP + 1;
          pTVar2[iVar1].Cur_Count = 1;
          pTVar2[iVar1].Def = pTVar6;
          iVar1 = pTVar6->range;
          if (iVar1 - 4U < 0xfffffffd) {
            exc->error = 0x84;
          }
          else {
            pFVar3 = exc->codeRangeTable[iVar1 - 1U].base;
            if (pFVar3 == (FT_Byte *)0x0) {
              exc->error = 0x8a;
            }
            else {
              lVar4 = pTVar6->start;
              lVar5 = exc->codeRangeTable[iVar1 - 1U].size;
              if (lVar5 < lVar4) {
                exc->error = 0x83;
              }
              else {
                exc->code = pFVar3;
                exc->codeSize = lVar5;
                exc->IP = lVar4;
                exc->curRange = iVar1;
              }
            }
          }
          exc->step_ins = '\0';
          return;
        }
        exc->error = 0x82;
        return;
      }
      pTVar6 = pTVar6 + 1;
    } while (pTVar6 < pTVar7);
  }
  exc->error = 0x80;
  return;
}

Assistant:

static void
  Ins_UNKNOWN( TT_ExecContext  exc )
  {
    TT_DefRecord*  def   = exc->IDefs;
    TT_DefRecord*  limit = FT_OFFSET( def, exc->numIDefs );


    for ( ; def < limit; def++ )
    {
      if ( (FT_Byte)def->opc == exc->opcode && def->active )
      {
        TT_CallRec*  call;


        if ( exc->callTop >= exc->callSize )
        {
          exc->error = FT_THROW( Stack_Overflow );
          return;
        }

        call = exc->callStack + exc->callTop++;

        call->Caller_Range = exc->curRange;
        call->Caller_IP    = exc->IP + 1;
        call->Cur_Count    = 1;
        call->Def          = def;

        Ins_Goto_CodeRange( exc, def->range, def->start );

        exc->step_ins = FALSE;
        return;
      }
    }

    exc->error = FT_THROW( Invalid_Opcode );
  }